

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

vector<int,_std::allocator<int>_> * backward::SignalHandling::make_default_signals(void)

{
  vector<int,_std::allocator<int>_> *in_RDI;
  int posix_signals [11];
  allocator_type *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *__first;
  vector<int,_std::allocator<int>_> *this;
  
  __first = (int *)0x700000006;
  this = (vector<int,_std::allocator<int>_> *)0x400000008;
  Catch::clara::std::allocator<int>::allocator((allocator<int> *)0x1d80b3);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            (this,__first,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Catch::clara::std::allocator<int>::~allocator((allocator<int> *)0x1d80d8);
  return in_RDI;
}

Assistant:

static std::vector<int> make_default_signals() {
    const int posix_signals[] = {
      // Signals for which the default action is "Core".
      SIGABRT, // Abort signal from abort(3)
      SIGBUS,  // Bus error (bad memory access)
      SIGFPE,  // Floating point exception
      SIGILL,  // Illegal Instruction
      SIGIOT,  // IOT trap. A synonym for SIGABRT
      SIGQUIT, // Quit from keyboard
      SIGSEGV, // Invalid memory reference
      SIGSYS,  // Bad argument to routine (SVr4)
      SIGTRAP, // Trace/breakpoint trap
      SIGXCPU, // CPU time limit exceeded (4.2BSD)
      SIGXFSZ, // File size limit exceeded (4.2BSD)
#if defined(BACKWARD_SYSTEM_DARWIN)
      SIGEMT, // emulation instruction executed
#endif
    };
    return std::vector<int>(posix_signals,
                            posix_signals +
                                sizeof posix_signals / sizeof posix_signals[0]);
  }